

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

int __thiscall pstore::romfs::romfs::chdir(romfs *this,char *__path)

{
  not_null<const_pstore::romfs::dirent_*> *pnVar1;
  not_null<const_pstore::romfs::directory_*> *pnVar2;
  error_code eVar3;
  error_code erc;
  error_code erc_00;
  error_or<const_pstore::romfs::directory_*> eo;
  undefined1 auStack_68 [24];
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_50;
  error_or<const_pstore::romfs::directory_*> local_38;
  directory *local_20;
  
  parse_path(&local_50,this,(not_null<const_char_*>)__path);
  if (local_50.has_error_ == false) {
    pnVar1 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                       (&local_50);
    dirent::opendir((dirent *)auStack_68,(char *)pnVar1->ptr_);
  }
  else {
    eVar3 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&local_50);
    erc._M_cat = eVar3._M_cat;
    erc._4_4_ = 0;
    erc._M_value = eVar3._M_value;
    error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::error_or
              ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)auStack_68,erc)
    ;
  }
  if (auStack_68[0x10] == false) {
    pnVar2 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                       ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                        auStack_68);
    local_20 = pnVar2->ptr_;
    (this->cwd_).ptr_ = local_20;
    gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&this->cwd_);
    error_or<pstore::romfs::directory_const*>::error_or<pstore::romfs::directory_const*const&,void>
              ((error_or<pstore::romfs::directory_const*> *)&local_38,&local_20);
  }
  else {
    eVar3 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error
                      ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                       auStack_68);
    erc_00._M_cat = eVar3._M_cat;
    erc_00._4_4_ = 0;
    erc_00._M_value = eVar3._M_value;
    error_or<const_pstore::romfs::directory_*>::error_or(&local_38,erc_00);
  }
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or
            ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)auStack_68);
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&local_50);
  eVar3 = error_or<const_pstore::romfs::directory_*>::get_error(&local_38);
  error_or<const_pstore::romfs::directory_*>::~error_or(&local_38);
  return eVar3._M_value;
}

Assistant:

std::error_code romfs::chdir (not_null<czstring> const path) {
            auto const dirent_to_directory = [] (dirent_ptr const de) { return de->opendir (); };

            auto const set_cwd = [this] (directory const * const d) {
                cwd_ = d; // Warning: side-effect!
                return error_or<directory const *> (d);
            };

            auto const eo = (this->parse_path (path) >>= dirent_to_directory) >>= set_cwd;
            return eo.get_error ();
        }